

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t zeGetModuleProcAddrTable(ze_api_version_t version,ze_module_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_module_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnCreate = driver::zeModuleCreate;
      pDdiTable->pfnDestroy = driver::zeModuleDestroy;
      pDdiTable->pfnDynamicLink = driver::zeModuleDynamicLink;
      pDdiTable->pfnGetNativeBinary = driver::zeModuleGetNativeBinary;
      pDdiTable->pfnGetGlobalPointer = driver::zeModuleGetGlobalPointer;
      pDdiTable->pfnGetKernelNames = driver::zeModuleGetKernelNames;
      pDdiTable->pfnGetProperties = driver::zeModuleGetProperties;
      pDdiTable->pfnGetFunctionPointer = driver::zeModuleGetFunctionPointer;
      pDdiTable->pfnInspectLinkageExt = driver::zeModuleInspectLinkageExt;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetModuleProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_module_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnCreate                                 = driver::zeModuleCreate;

    pDdiTable->pfnDestroy                                = driver::zeModuleDestroy;

    pDdiTable->pfnDynamicLink                            = driver::zeModuleDynamicLink;

    pDdiTable->pfnGetNativeBinary                        = driver::zeModuleGetNativeBinary;

    pDdiTable->pfnGetGlobalPointer                       = driver::zeModuleGetGlobalPointer;

    pDdiTable->pfnGetKernelNames                         = driver::zeModuleGetKernelNames;

    pDdiTable->pfnGetProperties                          = driver::zeModuleGetProperties;

    pDdiTable->pfnGetFunctionPointer                     = driver::zeModuleGetFunctionPointer;

    pDdiTable->pfnInspectLinkageExt                      = driver::zeModuleInspectLinkageExt;

    return result;
}